

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

ON_BrepVertex * __thiscall ON_BrepTrim::Vertex(ON_BrepTrim *this,int tvi)

{
  int i;
  int iVar1;
  ON_BrepVertex *pOStack_20;
  int vi;
  ON_BrepVertex *vertex;
  int tvi_local;
  ON_BrepTrim *this_local;
  
  pOStack_20 = (ON_BrepVertex *)0x0;
  if ((((this->m_brep != (ON_Brep *)0x0) && (-1 < tvi)) && (tvi < 2)) &&
     ((i = this->m_vi[tvi], -1 < i &&
      (iVar1 = ON_ClassArray<ON_BrepVertex>::Count
                         ((ON_ClassArray<ON_BrepVertex> *)&this->m_brep->m_V), i < iVar1)))) {
    pOStack_20 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&this->m_brep->m_V,i);
  }
  return pOStack_20;
}

Assistant:

ON_BrepVertex* ON_BrepTrim::Vertex(int tvi) const
{
  ON_BrepVertex* vertex = 0;
  if ( 0 != m_brep && 0 <= tvi && tvi <= 1 )
  {
    int vi = m_vi[tvi];
    if ( 0 <= vi && vi < m_brep->m_V.Count() )
    {
      vertex = &m_brep->m_V[vi];
    }
  }
  return vertex;  
}